

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::AddToSpends(CWallet *this,CWalletTx *wtx,WalletBatch *batch)

{
  long lVar1;
  element_type *peVar2;
  pointer pCVar3;
  bool bVar4;
  CTxIn *txin;
  pointer outpoint;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = CTransaction::IsCoinBase
                    ((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (!bVar4) {
    peVar2 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar3 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (outpoint = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; outpoint != pCVar3; outpoint = outpoint + 1) {
      AddToSpends(this,&outpoint->prevout,
                  &(((wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->hash).m_wrapped,batch);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddToSpends(const CWalletTx& wtx, WalletBatch* batch)
{
    if (wtx.IsCoinBase()) // Coinbases don't spend anything!
        return;

    for (const CTxIn& txin : wtx.tx->vin)
        AddToSpends(txin.prevout, wtx.GetHash(), batch);
}